

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O0

void __thiscall
Seismogramm<float>::SaveSegY
          (Seismogramm<float> *this,string *path,vector<float,_std::allocator<float>_> *times,
          bool save_empty_headers)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  reference pvVar4;
  reference pvVar5;
  float *pfVar6;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1380;
  long local_1360;
  ofstream additionalf;
  uint local_1160;
  uint local_115c;
  uint32 i_3;
  int i_2;
  char empty_trace_header [240];
  uint local_105c;
  undefined1 local_1058 [4];
  int i_1;
  char empty_bin_header [400];
  int local_ebc;
  undefined1 local_eb8 [4];
  int i;
  char text_header [3200];
  long local_228;
  ofstream outf;
  bool save_empty_headers_local;
  vector<float,_std::allocator<float>_> *times_local;
  string *path_local;
  Seismogramm<float> *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::data();
  _Var2 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(&local_228,pcVar3,_Var2);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"Error in writing SEG-Y file.\n");
    exit(1);
  }
  for (local_ebc = 0; local_ebc < 0xc80; local_ebc = local_ebc + 1) {
    local_eb8[local_ebc] = 0;
  }
  for (local_105c = 0; local_105c < 400; local_105c = local_105c + 1) {
    local_1058[(int)local_105c] = 0;
  }
  for (local_115c = 0; local_115c < 0xf0; local_115c = local_115c + 1) {
    *(undefined1 *)((long)&i_3 + (long)(int)local_115c) = 0;
  }
  std::ostream::write((char *)&local_228,(long)local_eb8);
  swap_header_endian(this);
  if (save_empty_headers) {
    std::ostream::write((char *)&local_228,(long)local_1058);
  }
  else {
    std::ostream::write((char *)&local_228,(long)&this->header_data);
  }
  swap_header_endian(this);
  swap_all_trace_headers_endian(this);
  swap_data_endian(this);
  for (local_1160 = 0; local_1160 < (this->header_data).num_of_traces_per_record;
      local_1160 = local_1160 + 1) {
    if (save_empty_headers) {
      std::ostream::write((char *)&local_228,(long)&i_3);
    }
    else {
      pvVar4 = std::vector<segy_trace_header,_std::allocator<segy_trace_header>_>::at
                         (&this->trace_header_data,(ulong)local_1160);
      std::ostream::write((char *)&local_228,(long)pvVar4);
    }
    pvVar5 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::at(&this->data,(ulong)local_1160);
    pfVar6 = std::vector<float,_std::allocator<float>_>::data(pvVar5);
    pvVar5 = std::
             vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ::at(&this->data,(ulong)local_1160);
    std::vector<float,_std::allocator<float>_>::size(pvVar5);
    std::ostream::write((char *)&local_228,(long)pfVar6);
  }
  swap_all_trace_headers_endian(this);
  swap_data_endian(this);
  std::ofstream::close();
  if (save_empty_headers) {
    std::operator+(&local_1380,path,".info.txt");
    pcVar3 = (char *)std::__cxx11::string::data();
    std::ofstream::ofstream(&local_1360,pcVar3,_S_out);
    std::__cxx11::string::~string((string *)&local_1380);
    bVar1 = std::ios::operator!((ios *)((long)&local_1360 + *(long *)(local_1360 + -0x18)));
    if ((bVar1 & 1) != 0) {
      std::operator<<((ostream *)&std::cout,"Error in writing SEG-Y file(additional info).\n");
      exit(1);
    }
    poVar7 = std::operator<<((ostream *)&local_1360,"Number of traces = ");
    poVar7 = (ostream *)
             std::ostream::operator<<(poVar7,(this->header_data).num_of_traces_per_record);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&local_1360,"Number of samples = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->header_data).samples_per_trace);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&local_1360,"Time step(in ms.) = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->header_data).sample_interval);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::ofstream::close();
    std::ofstream::~ofstream(&local_1360);
  }
  std::ofstream::~ofstream(&local_228);
  return;
}

Assistant:

void Seismogramm<Scalar>::SaveSegY(const std::string& path, const std::vector<Scalar>& times, bool save_empty_headers)
{
    std::ofstream outf (path.data(), std::ios::out | std::ios::binary);
    if (!outf)
    {
        std::cout << "Error in writing SEG-Y file.\n";
        std::exit(1);
    }

    char text_header[3200];
    for (int i = 0; i < 3200; i++)
        text_header[i] = 0;

    char empty_bin_header[sizeof(segy_bin_header_data)];
    for (int i = 0; i < sizeof(segy_bin_header_data); i++)
        empty_bin_header[i] = 0;

    char empty_trace_header[sizeof(segy_trace_header)];
    for (int i = 0; i < sizeof(segy_trace_header); i++)
        empty_trace_header[i] = 0;

    outf.write(text_header, 3200);




    // Saving Binary Header
    swap_header_endian();
    if (save_empty_headers)
        outf.write(reinterpret_cast<char*>(&empty_bin_header), sizeof(empty_bin_header));
    else
        outf.write(reinterpret_cast<char*>(&header_data), sizeof(header_data));
    swap_header_endian();

    // Saving Data and Trace Headers
    swap_all_trace_headers_endian();
    swap_data_endian();
    for (uint32 i = 0; i <  header_data.num_of_traces_per_record; i++)
    {
        if (save_empty_headers)
            outf.write(reinterpret_cast<char*>(&empty_trace_header), sizeof(empty_trace_header));
        else
            outf.write(reinterpret_cast<char*>(&trace_header_data.at(i)), sizeof(trace_header_data.at(i)));

        outf.write(reinterpret_cast<char*>(data.at(i).data()), sizeof(float) * data.at(i).size());
    }
    swap_all_trace_headers_endian();
    swap_data_endian();

    outf.close();

    // saving the most important additional info if headers are set to 0
    if (save_empty_headers)
    {
        std::ofstream additionalf ((path + ".info.txt").data(), std::ios::out);
        if (!additionalf)
        {
            std::cout << "Error in writing SEG-Y file(additional info).\n";
            std::exit(1);
        }
        additionalf << "Number of traces = " <<  header_data.num_of_traces_per_record << std::endl;
        additionalf << "Number of samples = " <<  header_data.samples_per_trace << std::endl;
        additionalf << "Time step(in ms.) = " <<  header_data.sample_interval << std::endl;
        additionalf.close();
    }
}